

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

int mbedtls_sha256_self_test(int verbose)

{
  uchar *input;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  mbedtls_sha256_context local_c8;
  uchar sha256sum [32];
  
  input = (uchar *)calloc(0x400,1);
  if (input == (uchar *)0x0) {
    iVar1 = 1;
    if (verbose != 0) {
      puts("Buffer allocation failed");
    }
  }
  else {
    local_c8.buffer[0x38] = '\0';
    local_c8.buffer[0x39] = '\0';
    local_c8.buffer[0x3a] = '\0';
    local_c8.buffer[0x3b] = '\0';
    local_c8.buffer[0x3c] = '\0';
    local_c8.buffer[0x3d] = '\0';
    local_c8.buffer[0x3e] = '\0';
    local_c8.buffer[0x3f] = '\0';
    local_c8.is224 = 0;
    local_c8.buffer[0x28] = '\0';
    local_c8.buffer[0x29] = '\0';
    local_c8.buffer[0x2a] = '\0';
    local_c8.buffer[0x2b] = '\0';
    local_c8.buffer[0x2c] = '\0';
    local_c8.buffer[0x2d] = '\0';
    local_c8.buffer[0x2e] = '\0';
    local_c8.buffer[0x2f] = '\0';
    local_c8.buffer[0x30] = '\0';
    local_c8.buffer[0x31] = '\0';
    local_c8.buffer[0x32] = '\0';
    local_c8.buffer[0x33] = '\0';
    local_c8.buffer[0x34] = '\0';
    local_c8.buffer[0x35] = '\0';
    local_c8.buffer[0x36] = '\0';
    local_c8.buffer[0x37] = '\0';
    local_c8.buffer[0x18] = '\0';
    local_c8.buffer[0x19] = '\0';
    local_c8.buffer[0x1a] = '\0';
    local_c8.buffer[0x1b] = '\0';
    local_c8.buffer[0x1c] = '\0';
    local_c8.buffer[0x1d] = '\0';
    local_c8.buffer[0x1e] = '\0';
    local_c8.buffer[0x1f] = '\0';
    local_c8.buffer[0x20] = '\0';
    local_c8.buffer[0x21] = '\0';
    local_c8.buffer[0x22] = '\0';
    local_c8.buffer[0x23] = '\0';
    local_c8.buffer[0x24] = '\0';
    local_c8.buffer[0x25] = '\0';
    local_c8.buffer[0x26] = '\0';
    local_c8.buffer[0x27] = '\0';
    local_c8.buffer[8] = '\0';
    local_c8.buffer[9] = '\0';
    local_c8.buffer[10] = '\0';
    local_c8.buffer[0xb] = '\0';
    local_c8.buffer[0xc] = '\0';
    local_c8.buffer[0xd] = '\0';
    local_c8.buffer[0xe] = '\0';
    local_c8.buffer[0xf] = '\0';
    local_c8.buffer[0x10] = '\0';
    local_c8.buffer[0x11] = '\0';
    local_c8.buffer[0x12] = '\0';
    local_c8.buffer[0x13] = '\0';
    local_c8.buffer[0x14] = '\0';
    local_c8.buffer[0x15] = '\0';
    local_c8.buffer[0x16] = '\0';
    local_c8.buffer[0x17] = '\0';
    local_c8.state[6] = 0;
    local_c8.state[7] = 0;
    local_c8.buffer[0] = '\0';
    local_c8.buffer[1] = '\0';
    local_c8.buffer[2] = '\0';
    local_c8.buffer[3] = '\0';
    local_c8.buffer[4] = '\0';
    local_c8.buffer[5] = '\0';
    local_c8.buffer[6] = '\0';
    local_c8.buffer[7] = '\0';
    local_c8.state[2] = 0;
    local_c8.state[3] = 0;
    local_c8.state[4] = 0;
    local_c8.state[5] = 0;
    local_c8.total[0] = 0;
    local_c8.total[1] = 0;
    local_c8.state[0] = 0;
    local_c8.state[1] = 0;
    for (uVar3 = 0; uVar3 != 6; uVar3 = uVar3 + 1) {
      uVar2 = (uint)uVar3 - 3;
      if (uVar3 < 3) {
        uVar2 = (uint)uVar3;
      }
      if (verbose != 0) {
        printf("  SHA-%d test #%d: ",(ulong)((uint)(2 < uVar3) * 0x20 + 0xe0),(ulong)(uVar2 + 1));
      }
      local_c8.total[0] = 0;
      local_c8.total[1] = 0;
      local_c8.state[0] = 0xc1059ed8;
      local_c8.state[1] = 0x367cd507;
      local_c8.state[2] = 0x3070dd17;
      local_c8.state[3] = 0xf70e5939;
      if (2 < uVar3) {
        local_c8.state[0] = 0x6a09e667;
        local_c8.state[1] = 0xbb67ae85;
        local_c8.state[2] = 0x3c6ef372;
        local_c8.state[3] = 0xa54ff53a;
      }
      local_c8.state[4] = 0xffc00b31;
      local_c8.state[5] = 0x68581511;
      local_c8.state[6] = 0x64f98fa7;
      local_c8.state[7] = 0xbefa4fa4;
      if (2 < uVar3) {
        local_c8.state[4] = 0x510e527f;
        local_c8.state[5] = 0x9b05688c;
        local_c8.state[6] = 0x1f83d9ab;
        local_c8.state[7] = 0x5be0cd19;
      }
      local_c8.is224._0_1_ = uVar3 < 3;
      local_c8.is224._1_3_ = 0;
      if (uVar2 == 2) {
        memset(input,0x61,1000);
        iVar1 = 1000;
        while (bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, bVar4) {
          mbedtls_sha256_update(&local_c8,input,1000);
        }
      }
      else {
        mbedtls_sha256_update(&local_c8,sha256_test_buf[uVar2],(long)sha256_test_buflen[uVar2]);
      }
      mbedtls_sha256_finish(&local_c8,sha256sum);
      iVar1 = bcmp(sha256sum,sha256_test_sum + uVar3,(ulong)(2 < uVar3) * 4 + 0x1c);
      if (iVar1 != 0) {
        iVar1 = 1;
        if (verbose != 0) {
          puts("failed");
        }
        goto LAB_00109d09;
      }
      if (verbose != 0) {
        puts("passed");
      }
    }
    iVar1 = 0;
    if (verbose != 0) {
      putchar(10);
      iVar1 = 0;
    }
LAB_00109d09:
    mbedtls_sha256_free(&local_c8);
    free(input);
  }
  return iVar1;
}

Assistant:

int mbedtls_sha256_self_test( int verbose )
{
    int i, j, k, buflen, ret = 0;
    unsigned char *buf;
    unsigned char sha256sum[32];
    mbedtls_sha256_context ctx;

    buf = mbedtls_calloc( 1024, sizeof(unsigned char) );
    if( NULL == buf )
    {
        if( verbose != 0 )
            mbedtls_printf( "Buffer allocation failed\n" );

        return( 1 );
    }

    mbedtls_sha256_init( &ctx );

    for( i = 0; i < 6; i++ )
    {
        j = i % 3;
        k = i < 3;

        if( verbose != 0 )
            mbedtls_printf( "  SHA-%d test #%d: ", 256 - k * 32, j + 1 );

        mbedtls_sha256_starts( &ctx, k );

        if( j == 2 )
        {
            memset( buf, 'a', buflen = 1000 );

            for( j = 0; j < 1000; j++ )
                mbedtls_sha256_update( &ctx, buf, buflen );
        }
        else
            mbedtls_sha256_update( &ctx, sha256_test_buf[j],
                                 sha256_test_buflen[j] );

        mbedtls_sha256_finish( &ctx, sha256sum );

        if( memcmp( sha256sum, sha256_test_sum[i], 32 - k * 4 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_sha256_free( &ctx );
    mbedtls_free( buf );

    return( ret );
}